

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

bool __thiscall pugi::xml_node::remove_child(xml_node *this,xml_node *n)

{
  xml_node_struct *pxVar1;
  xml_node_struct *node;
  xml_allocator *alloc;
  bool bVar2;
  
  pxVar1 = this->_root;
  if (pxVar1 != (xml_node_struct *)0x0) {
    node = n->_root;
    if ((node == (xml_node_struct *)0x0) || (node->parent != pxVar1)) {
      bVar2 = false;
    }
    else {
      alloc = *(xml_allocator **)((long)pxVar1 - (pxVar1->header >> 8));
      impl::anon_unknown_0::remove_node(node);
      impl::anon_unknown_0::destroy_node(n->_root,alloc);
      bVar2 = true;
    }
    return bVar2;
  }
  return false;
}

Assistant:

PUGI_IMPL_FN bool xml_node::remove_child(const xml_node& n)
	{
		if (!_root || !n._root || n._root->parent != _root) return false;

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return false;

		impl::remove_node(n._root);
		impl::destroy_node(n._root, alloc);

		return true;
	}